

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gotcha_auxv.c
# Opt level: O2

link_map * get_vdso_from_aliases(void)

{
  link_map *plVar1;
  int iVar2;
  code *pcVar3;
  char **ppcVar4;
  
  pcVar3 = std::__throw_regex_error;
  do {
    plVar1 = *(link_map **)pcVar3;
    if (plVar1 == (link_map *)0x0) {
      return (link_map *)0x0;
    }
    for (ppcVar4 = vdso_aliases; *ppcVar4 != (char *)0x0; ppcVar4 = ppcVar4 + 1) {
      if ((plVar1->l_name != (char *)0x0) && (iVar2 = strcmp(plVar1->l_name,*ppcVar4), iVar2 == 0))
      {
        return plVar1;
      }
    }
    pcVar3 = (code *)&plVar1->l_next;
  } while( true );
}

Assistant:

struct link_map *get_vdso_from_aliases() {
  struct link_map *m = NULL;
  char **aliases = NULL;

  for (m = _r_debug.r_map; m; m = m->l_next) {
    for (aliases = vdso_aliases; *aliases; aliases++) {
      if (m->l_name && gotcha_strcmp(m->l_name, *aliases) == 0) {
        return m;  // GCOVR_EXCL_LINE
      }
    }
  }
  return NULL;
}